

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

roaring_bitmap_t * roaring_bitmap_from_range(uint64_t min,uint64_t max,uint32_t step)

{
  uint8_t typecode;
  roaring_array_t *r;
  array_container_t *arr;
  uint32_t max_00;
  ulong uVar1;
  uint min_00;
  uint uVar2;
  uint32_t value;
  uint8_t local_45;
  uint local_44;
  ulong local_40;
  roaring_array_t *local_38;
  
  uVar1 = 0x100000000;
  if (max < 0x100000000) {
    uVar1 = max;
  }
  if (min < uVar1 && step != 0) {
    r = &roaring_bitmap_create()->high_low_container;
    if (step < 0x10000) {
      local_44 = step & 0xffff;
      local_40 = uVar1;
      local_38 = r;
      do {
        uVar1 = local_40 - ((uint)min & 0xffff0000);
        if (0xffff < uVar1) {
          uVar1 = 0x10000;
        }
        min_00 = (uint)min & 0xffff;
        max_00 = (uint32_t)uVar1;
        if (step == 1) {
          arr = (array_container_t *)container_range_of_ones(min_00,max_00,&local_45);
          uVar2 = ~min_00 + 1 + max_00;
          typecode = local_45;
        }
        else {
          uVar2 = ~min_00 + step + max_00;
          if (uVar2 / step < 0x1001) {
            arr = array_container_create_given_capacity(uVar2 / step);
            array_container_add_from_range(arr,min_00,max_00,(uint16_t)local_44);
            typecode = '\x02';
          }
          else {
            arr = (array_container_t *)bitset_container_create();
            bitset_container_add_from_range
                      ((bitset_container_t *)arr,min_00,max_00,(uint16_t)local_44);
            typecode = '\x01';
          }
        }
        r = local_38;
        ra_append(local_38,(uint16_t)(min >> 0x10),arr,typecode);
        min = min + (uVar2 - uVar2 % step);
      } while (min < local_40);
    }
    else {
      for (; (min & 0xffffffff) < max; min = (uint64_t)((uint32_t)min + step)) {
        roaring_bitmap_add((roaring_bitmap_t *)r,(uint32_t)min);
      }
    }
  }
  else {
    r = (roaring_array_t *)0x0;
  }
  return (roaring_bitmap_t *)r;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_from_range(uint64_t min, uint64_t max,
                                            uint32_t step) {
    if (max >= UINT64_C(0x100000000)) {
        max = UINT64_C(0x100000000);
    }
    if (step == 0) return NULL;
    if (max <= min) return NULL;
    roaring_bitmap_t *answer = roaring_bitmap_create();
    if (step >= (1 << 16)) {
        for (uint32_t value = (uint32_t)min; value < max; value += step) {
            roaring_bitmap_add(answer, value);
        }
        return answer;
    }
    uint64_t min_tmp = min;
    do {
        uint32_t key = (uint32_t)min_tmp >> 16;
        uint32_t container_min = min_tmp & 0xFFFF;
        uint32_t container_max =
            (uint32_t)minimum_uint64(max - (key << 16), 1 << 16);
        uint8_t type;
        container_t *container = container_from_range(
            &type, container_min, container_max, (uint16_t)step);
        ra_append(&answer->high_low_container, (uint16_t)key, container, type);
        uint32_t gap = container_max - container_min + step - 1;
        min_tmp += gap - (gap % step);
    } while (min_tmp < max);
    // cardinality of bitmap will be ((uint64_t) max - min + step - 1 ) / step
    return answer;
}